

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O3

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::LogFreeDecommittedSegment
          (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           *this,SegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment)

{
  size_t sVar1;
  PageMemoryData *pPVar2;
  undefined1 in_XMM1 [16];
  undefined1 auVar3 [16];
  
  sVar1 = segment->segmentPageCount;
  this->reservedBytes = this->reservedBytes + sVar1 * -0x1000;
  this->numberOfSegments = this->numberOfSegments - 1;
  pPVar2 = this->memoryData;
  if (pPVar2 != (PageMemoryData *)0x0) {
    auVar3 = pmovsxbq(in_XMM1,0x101);
    pPVar2->releaseSegmentCount = auVar3._0_8_ + pPVar2->releaseSegmentCount;
    pPVar2->releaseSegmentBytes = sVar1 * 0x1000 + pPVar2->releaseSegmentBytes;
  }
  return;
}

Assistant:

size_t GetPageCount() const { return segmentPageCount; }